

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O2

HighsDebugStatus debugNonbasicFlagConsistent(HighsOptions *options,HighsLp *lp,SimplexBasis *basis)

{
  pointer pcVar1;
  ulong uVar2;
  HighsDebugStatus HVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((options->super_HighsOptionsStruct).highs_debug_level < 1) {
    HVar3 = kNotChecked;
  }
  else {
    uVar4 = lp->num_row_ + lp->num_col_;
    pcVar1 = (basis->nonbasicFlag_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    HVar3 = kOk;
    if (uVar4 != *(int *)&(basis->nonbasicFlag_).
                          super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (int)pcVar1) {
      HVar3 = kLogicalError;
      highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                  "nonbasicFlag size error\n");
      pcVar1 = (basis->nonbasicFlag_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      uVar6 = (ulong)((int)uVar6 + (uint)(pcVar1[uVar2] == '\0'));
    }
    if ((int)uVar6 != lp->num_row_) {
      highsLogDev(&(options->super_HighsOptionsStruct).log_options,kError,
                  "nonbasicFlag has %d, not %d basic variables\n",uVar6);
      HVar3 = kLogicalError;
    }
  }
  return HVar3;
}

Assistant:

HighsDebugStatus debugNonbasicFlagConsistent(const HighsOptions& options,
                                             const HighsLp& lp,
                                             const SimplexBasis& basis) {
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  HighsInt numTot = lp.num_col_ + lp.num_row_;
  const bool right_size = (HighsInt)basis.nonbasicFlag_.size() == numTot;
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  HighsInt num_basic_variables = 0;
  for (HighsInt var = 0; var < numTot; var++) {
    if (basis.nonbasicFlag_[var] == kNonbasicFlagFalse) {
      num_basic_variables++;
    } else {
      assert(basis.nonbasicFlag_[var] == kNonbasicFlagTrue);
    }
  }
  bool right_num_basic_variables = num_basic_variables == lp.num_row_;
  if (!right_num_basic_variables) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag has %" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT
                " basic variables\n",
                num_basic_variables, lp.num_row_);
    assert(right_num_basic_variables);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}